

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::PairMatcherImpl<std::pair<bool_const,bool>const&>::PairMatcherImpl<bool,bool>
          (PairMatcherImpl<std::pair<bool_const,bool>const&> *this,bool first_matcher,
          bool second_matcher)

{
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  testing local_12;
  testing local_11;
  bool second_matcher_local;
  PairMatcherImpl<std::pair<bool_const,bool>const&> *pPStack_10;
  bool first_matcher_local;
  PairMatcherImpl<const_std::pair<const_bool,_bool>_&> *this_local;
  
  local_12 = (testing)second_matcher;
  local_11 = (testing)first_matcher;
  pPStack_10 = this;
  MatcherInterface<const_std::pair<const_bool,_bool>_&>::MatcherInterface
            ((MatcherInterface<const_std::pair<const_bool,_bool>_&> *)this);
  *(undefined ***)this = &PTR__PairMatcherImpl_029d78a0;
  SafeMatcherCast<bool_const&,bool>
            ((Matcher<const_bool_&> *)(this + 8),&local_11,
             (bool *)CONCAT71(extraout_var,extraout_DL));
  SafeMatcherCast<bool_const&,bool>
            ((Matcher<const_bool_&> *)(this + 0x20),&local_12,
             (bool *)CONCAT71(extraout_var_00,extraout_DL_00));
  return;
}

Assistant:

PairMatcherImpl(FirstMatcher first_matcher, SecondMatcher second_matcher)
      : first_matcher_(
            testing::SafeMatcherCast<const FirstType&>(first_matcher)),
        second_matcher_(
            testing::SafeMatcherCast<const SecondType&>(second_matcher)) {}